

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O1

Vec_Wec_t * Mpm_ManFindDsdMatches(Mpm_Man_t *p,void *pScl)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  Vec_Wec_t *pVVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int Config;
  word Truth;
  uint local_4c;
  Vec_Wec_t *local_48;
  Vec_Int_t *local_40;
  word local_38;
  
  iVar1 = p->pPars->fVeryVerbose;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  pVVar4->nCap = 600;
  pVVar4->nSize = 0;
  local_40 = (Vec_Int_t *)calloc(600,0x10);
  pVVar4->pArray = local_40;
  pVVar4->nSize = 600;
  local_48 = pVVar4;
  if (0 < *(int *)((long)pScl + 0x74)) {
    lVar7 = 0;
    do {
      puVar3 = *(undefined8 **)(*(long *)((long)pScl + 0x78) + lVar7 * 8);
      iVar2 = *(int *)(puVar3 + 8);
      lVar5 = (long)iVar2;
      if ((lVar5 < 7) && (*(int *)((long)puVar3 + 0x44) < 2)) {
        if ((iVar2 < 0) || (*(int *)((long)puVar3 + 0x34) <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        local_38 = **(word **)(*(long *)(puVar3[7] + lVar5 * 8) + 0x38);
        local_4c = Mpm_CutCheckDsd6(p,local_38);
        if (local_4c == 0xffffffff) {
          if (iVar1 != 0) {
            printf("Skipping cell %s with non-DSD function\n",*puVar3);
          }
        }
        else {
          uVar6 = (int)local_4c >> 0x11;
          local_4c = local_4c & 0x1ffff | *(int *)(puVar3 + 1) << 0x11;
          if (599 < uVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(local_40 + uVar6,local_4c);
          if (iVar1 != 0) {
            printf("Gate %5d  %-30s : ",(ulong)*(uint *)(puVar3 + 1),*puVar3);
            printf("Class %3d  ",(ulong)uVar6);
            printf("Area %10.3f  ",(double)*(float *)(puVar3 + 3));
            Extra_PrintBinary(_stdout,&local_4c,0x11);
            printf("   ");
            Kit_DsdPrintFromTruth((uint *)&local_38,*(int *)(puVar3 + 8));
            putchar(10);
          }
        }
      }
      else if (iVar1 != 0) {
        printf("Skipping cell %s with %d inputs and %d outputs\n",*puVar3,lVar5,
               (ulong)*(uint *)((long)puVar3 + 0x44));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)((long)pScl + 0x74));
  }
  return local_48;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds matches fore each DSD class.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Wec_t * Mpm_ManFindDsdMatches( Mpm_Man_t * p, void * pScl )
{
    int fVerbose = p->pPars->fVeryVerbose;
    SC_Lib * pLib = (SC_Lib *)pScl;
    Vec_Wec_t * vClasses;
    Vec_Int_t * vClass;
    SC_Cell * pRepr;
    int i, Config, iClass;
    word Truth;
    vClasses = Vec_WecStart( 600 );
    SC_LibForEachCellClass( pLib, pRepr, i )
    {
        if ( pRepr->n_inputs > 6 || pRepr->n_outputs > 1 )
        {
            if ( fVerbose )
            printf( "Skipping cell %s with %d inputs and %d outputs\n", pRepr->pName, pRepr->n_inputs, pRepr->n_outputs );
            continue;
        }
        Truth = *Vec_WrdArray( &SC_CellPin(pRepr, pRepr->n_inputs)->vFunc );
        Config = Mpm_CutCheckDsd6( p, Truth );
        if ( Config == -1 )
        {
            if ( fVerbose )
            printf( "Skipping cell %s with non-DSD function\n", pRepr->pName );
            continue;
        }
        iClass = Config >> 17;
        Config = (pRepr->Id << 17) | (Config & 0x1FFFF);
        // write gate and NPN config for this DSD class
        vClass = Vec_WecEntry( vClasses, iClass );
        Vec_IntPush( vClass, Config );
        if ( !fVerbose )
            continue;

        printf( "Gate %5d  %-30s : ", pRepr->Id, pRepr->pName );
        printf( "Class %3d  ", iClass );
        printf( "Area %10.3f  ", pRepr->area );
        Extra_PrintBinary( stdout, (unsigned *)&Config, 17 );
        printf( "   " );
        Kit_DsdPrintFromTruth( (unsigned *)&Truth, pRepr->n_inputs ); printf( "\n" );
    }
    return vClasses;
}